

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_utils_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_33929::DataDictionaryUtilsTest_TestAddAllFields_Test::
DataDictionaryUtilsTest_TestAddAllFields_Test(DataDictionaryUtilsTest_TestAddAllFields_Test *this)

{
  DataDictionaryUtilsTest_TestAddAllFields_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__DataDictionaryUtilsTest_TestAddAllFields_Test_003d2248;
  return;
}

Assistant:

TEST(DataDictionaryUtilsTest, TestAddAllFields)
{
    ExtendableDataDictionary data_dictionary = ExtendableDataDictionary();
    data_dictionary.AddFieldDef(bid);
    data_dictionary.AddFieldDef(ask);
    std::vector<FieldDef> inter_vector = {bid_size, ask_size};
    DataDictionaryUtils::AddAllFields(data_dictionary, inter_vector);
    std::vector<FieldDef> actual = {bid, ask, bid_size, ask_size};
    ASSERT_TRUE(actual == data_dictionary.AllFieldDefs());
}